

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall testing::internal::StringStreamToString(internal *this,stringstream *ss)

{
  char *pcVar1;
  long lVar2;
  size_t extraout_RDX;
  String SVar3;
  string local_210 [32];
  char *local_1f0;
  char *ch;
  stringstream local_1d8 [8];
  stringstream helper;
  ostream local_1c8 [376];
  char *local_50;
  char *end;
  char *start;
  char **local_20;
  string *str;
  stringstream *ss_local;
  
  str = (string *)ss;
  ss_local = (stringstream *)this;
  std::__cxx11::stringstream::str();
  local_20 = &start;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  end = pcVar1;
  lVar2 = std::__cxx11::string::length();
  local_50 = pcVar1 + lVar2;
  std::__cxx11::stringstream::stringstream(local_1d8);
  for (local_1f0 = end; local_1f0 != local_50; local_1f0 = local_1f0 + 1) {
    if (*local_1f0 == '\0') {
      std::operator<<(local_1c8,"\\0");
    }
    else {
      std::ostream::put((char)local_1c8);
    }
  }
  std::__cxx11::stringstream::str();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  String::String((String *)this,pcVar1);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::__cxx11::string::~string((string *)&start);
  SVar3.length_ = extraout_RDX;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String StringStreamToString(::std::stringstream* ss) {
  const ::std::string& str = ss->str();
  const char* const start = str.c_str();
  const char* const end = start + str.length();

  // We need to use a helper stringstream to do this transformation
  // because String doesn't support push_back().
  ::std::stringstream helper;
  for (const char* ch = start; ch != end; ++ch) {
    if (*ch == '\0') {
      helper << "\\0";  // Replaces NUL with "\\0";
    } else {
      helper.put(*ch);
    }
  }

  return String(helper.str().c_str());
}